

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::push_leaf
          (iterator *this,node_ptr aleaf)

{
  undefined1 local_30 [24];
  iterator *local_18;
  iterator *this_local;
  node_ptr aleaf_local;
  
  local_30[8] = 0xff;
  local_30[9] = 0xff;
  local_30._0_8_ = aleaf.tagged_ptr;
  local_18 = this;
  this_local = (iterator *)aleaf.tagged_ptr;
  detail::key_prefix_snapshot::key_prefix_snapshot((key_prefix_snapshot *)(local_30 + 0x10),0);
  std::
  stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
  ::push(&this->stack_,(value_type *)local_30);
  return;
}

Assistant:

void push_leaf(detail::node_ptr aleaf) {
      // Mock up a stack entry for the leaf.
      stack_.push({
          aleaf,
          static_cast<std::byte>(0xFFU),     // ignored for leaf
          static_cast<std::uint8_t>(0xFFU),  // ignored for leaf
          detail::key_prefix_snapshot(0)     // ignored for leaf
      });
      // No change in the key_buffer.
    }